

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pri.c
# Opt level: O0

bool_t priIsSGPrime(word *q,size_t n,void *stack)

{
  int iVar1;
  word *a;
  qr_o *r;
  word *in_RDX;
  size_t in_RSI;
  word *in_RDI;
  qr_o *qr;
  word *p;
  size_t no;
  word *in_stack_00000038;
  word *in_stack_00000040;
  word *stack_00;
  word *dest;
  
  a = (word *)((in_RSI + 1) * 8);
  stack_00 = in_RDX + in_RSI + 1;
  dest = stack_00;
  zmCreate_keep((size_t)a);
  wwCopy(in_RDX,in_RDI,in_RSI);
  in_RDX[in_RSI] = 0;
  wwShHi(a,(size_t)in_RDX,(size_t)dest);
  *in_RDX = *in_RDX + 1;
  r = (qr_o *)wwOctetSize(in_RDX,in_RSI + 1);
  u64To(dest,(size_t)stack_00,(u64 *)0x195454);
  zmCreate(r,(octet *)in_RDX,(size_t)dest,stack_00);
  (*(code *)dest[10])(in_RDX,dest[4],dest[4],dest);
  (*(code *)dest[10])(in_RDX,in_RDX,in_RDX,dest);
  qrPower(in_stack_00000040,in_stack_00000038,q,n,(qr_o *)stack,(void *)no);
  iVar1 = wwCmp(in_RDX,(word *)dest[4],dest[6]);
  return (bool_t)(iVar1 == 0);
}

Assistant:

bool_t priIsSGPrime(const word q[], size_t n, void* stack)
{
	size_t no = O_OF_W(n + 1);
	// переменные в stack
	word* p;
	qr_o* qr;
	// pre
	ASSERT(zzIsOdd(q, n) && wwCmpW(q, n, 1) > 0);
	// раскладка стек
	p = (word*)stack;
	qr = (qr_o*)(p + n + 1);
	stack = (octet*)qr + zmCreate_keep(no);
	// p <- 2q + 1
	wwCopy(p, q, n);
	p[n] = 0;
	wwShHi(p, n + 1, 1);
	++p[0];
	// создать кольцо \mod p
	no = wwOctetSize(p, n + 1);
	wwTo(p, no, p);
	zmCreate(qr, (octet*)p, no, stack);
	// p <- 4^q (в кольце qr)
	qrAdd(p, qr->unity, qr->unity, qr);
	qrAdd(p, p, p, qr);
	qrPower(p, p, q, n, qr, stack);
	// 4^q == 1 (в кольце qr)?
	return qrCmp(p, qr->unity, qr) == 0;
}